

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::GridDataType1::GridDataType1
          (GridDataType1 *this,KUINT16 SampleType,KUINT16 DataRepresentation,KDataStream *stream)

{
  KDataStream *pKVar1;
  ushort local_30;
  unsigned_short local_2e [3];
  KUINT16 i;
  KUINT16 tmp;
  KDataStream *local_20;
  KDataStream *stream_local;
  KUINT16 DataRepresentation_local;
  GridDataType1 *pGStack_10;
  KUINT16 SampleType_local;
  GridDataType1 *this_local;
  
  local_20 = stream;
  stream_local._4_2_ = DataRepresentation;
  stream_local._6_2_ = SampleType;
  pGStack_10 = this;
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType1_00330c68;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector(&this->m_vui16Values);
  (this->super_GridData).m_ui16SmpTyp = stream_local._6_2_;
  (this->super_GridData).m_ui16DtRep = stream_local._4_2_;
  pKVar1 = KDataStream::operator>>(local_20,(float *)&(this->super_GridData).field_0xc);
  pKVar1 = KDataStream::operator>>(pKVar1,(float *)&this->m_f32FieldOffset);
  KDataStream::operator>>(pKVar1,&this->m_ui16NumValues);
  local_2e[0] = 0;
  for (local_30 = 0; local_30 < this->m_ui16NumValues; local_30 = local_30 + 1) {
    KDataStream::operator>>(local_20,local_2e);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (&this->m_vui16Values,local_2e);
  }
  if ((uint)this->m_ui16NumValues % 2 == 1) {
    KDataStream::operator>>(local_20,&this->m_ui16Padding);
  }
  return;
}

Assistant:

GridDataType1::GridDataType1( KUINT16 SampleType, KUINT16 DataRepresentation, KDataStream & stream )
{
    m_ui16SmpTyp = SampleType;
    m_ui16DtRep = DataRepresentation;
    stream >> m_f32FieldScale
           >> m_f32FieldOffset
           >> m_ui16NumValues;

    KUINT16 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vui16Values.push_back( tmp );
    }

    // Do we need to extract any padding?
    if( m_ui16NumValues % 2 == 1 )
    {
        stream >> m_ui16Padding;
    }
}